

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O0

Move * __thiscall
puppup::Game::thinkyThinky(Move *__return_storage_ptr__,Game *this,idx max_moves,idx samples)

{
  bool bVar1;
  reference pvVar2;
  reference __src;
  long lVar3;
  size_t *psVar4;
  size_t *psVar5;
  byte bVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  size_t asStack_21f8 [514];
  Move *local_11e8;
  Move *local_11e0;
  Game *local_11d8;
  size_t *local_11d0;
  Gaddag *local_11c8;
  vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *local_11c0;
  reference local_11b8;
  Move *mov;
  iterator __end2;
  iterator __begin2;
  set<puppup::movegen::Move,_std::greater<puppup::movegen::Move>,_std::allocator<puppup::movegen::Move>_>
  *__range2;
  Move *local_1180;
  __normal_iterator<puppup::movegen::Move_*,_std::vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>_>
  local_1178;
  undefined1 local_1170 [8];
  set<puppup::movegen::Move,_std::greater<puppup::movegen::Move>,_std::allocator<puppup::movegen::Move>_>
  moves_set;
  undefined1 local_38 [8];
  vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> moves;
  idx samples_local;
  idx max_moves_local;
  Game *this_local;
  
  bVar6 = 0;
  local_11e8 = __return_storage_ptr__;
  local_11e0 = __return_storage_ptr__;
  local_11d8 = this;
  moves.super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)samples;
  pvVar2 = std::array<std::array<long,_32UL>,_2UL>::operator[](&this->racks_,this->turn_);
  auVar7 = vmovdqu64_avx512f(*(undefined1 (*) [64])pvVar2->_M_elems);
  auVar8 = vmovdqu64_avx512f(*(undefined1 (*) [64])(pvVar2->_M_elems + 8));
  auVar9 = vmovdqu64_avx512f(*(undefined1 (*) [64])(pvVar2->_M_elems + 0x10));
  auVar10 = vmovdqu64_avx512f(*(undefined1 (*) [64])(pvVar2->_M_elems + 0x18));
  auVar10 = vmovdqu64_avx512f(auVar10);
  auVar9 = vmovdqu64_avx512f(auVar9);
  auVar8 = vmovdqu64_avx512f(auVar8);
  auVar7 = vmovdqu64_avx512f(auVar7);
  local_11c8 = local_11d8->gaddag_;
  local_11d0 = &moves_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
  memcpy(local_11d0,&local_11d8->state_,0x1008);
  psVar4 = local_11d0;
  psVar5 = asStack_21f8;
  for (lVar3 = 0x201; lVar3 != 0; lVar3 = lVar3 + -1) {
    *psVar5 = *psVar4;
    psVar4 = psVar4 + (ulong)bVar6 * -2 + 1;
    psVar5 = psVar5 + (ulong)bVar6 * -2 + 1;
  }
  auVar7 = vmovdqu64_avx512f(auVar7);
  auVar8 = vmovdqu64_avx512f(auVar8);
  auVar9 = vmovdqu64_avx512f(auVar9);
  auVar10 = vmovdqu64_avx512f(auVar10);
  vmovdqu64_avx512f(auVar10);
  vmovdqu64_avx512f(auVar9);
  vmovdqu64_avx512f(auVar8);
  vmovdqu64_avx512f(auVar7);
  local_11c0 = (vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *)local_38;
  movegen::genFromBoard(local_11c0,local_11c8,0);
  local_1178._M_current =
       (Move *)std::vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>::begin
                         (local_11c0);
  local_1180 = (Move *)std::vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>::
                       end(local_11c0);
  std::
  set<puppup::movegen::Move,std::greater<puppup::movegen::Move>,std::allocator<puppup::movegen::Move>>
  ::
  set<__gnu_cxx::__normal_iterator<puppup::movegen::Move*,std::vector<puppup::movegen::Move,std::allocator<puppup::movegen::Move>>>>
            ((set<puppup::movegen::Move,std::greater<puppup::movegen::Move>,std::allocator<puppup::movegen::Move>>
              *)local_1170,local_1178,
             (__normal_iterator<puppup::movegen::Move_*,_std::vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>_>
              )local_1180);
  __range2 = (set<puppup::movegen::Move,_std::greater<puppup::movegen::Move>,_std::allocator<puppup::movegen::Move>_>
              *)std::
                set<puppup::movegen::Move,_std::greater<puppup::movegen::Move>,_std::allocator<puppup::movegen::Move>_>
                ::begin((set<puppup::movegen::Move,_std::greater<puppup::movegen::Move>,_std::allocator<puppup::movegen::Move>_>
                         *)local_1170);
  __src = std::_Rb_tree_const_iterator<puppup::movegen::Move>::operator*
                    ((_Rb_tree_const_iterator<puppup::movegen::Move> *)&__range2);
  memcpy(local_11e8,__src,0x28);
  __end2 = std::
           set<puppup::movegen::Move,_std::greater<puppup::movegen::Move>,_std::allocator<puppup::movegen::Move>_>
           ::begin((set<puppup::movegen::Move,_std::greater<puppup::movegen::Move>,_std::allocator<puppup::movegen::Move>_>
                    *)local_1170);
  mov = (Move *)std::
                set<puppup::movegen::Move,_std::greater<puppup::movegen::Move>,_std::allocator<puppup::movegen::Move>_>
                ::end((set<puppup::movegen::Move,_std::greater<puppup::movegen::Move>,_std::allocator<puppup::movegen::Move>_>
                       *)local_1170);
  samples_local = max_moves;
  while (bVar1 = std::operator!=(&__end2,(_Self *)&mov), bVar1) {
    local_11b8 = std::_Rb_tree_const_iterator<puppup::movegen::Move>::operator*(&__end2);
    movegen::print(local_11b8,&local_11d8->state_,local_11d8->gaddag_);
    samples_local = samples_local + -1;
    if (samples_local == 0) break;
    std::_Rb_tree_const_iterator<puppup::movegen::Move>::operator++(&__end2);
  }
  std::
  set<puppup::movegen::Move,_std::greater<puppup::movegen::Move>,_std::allocator<puppup::movegen::Move>_>
  ::~set((set<puppup::movegen::Move,_std::greater<puppup::movegen::Move>,_std::allocator<puppup::movegen::Move>_>
          *)local_1170);
  std::vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>::~vector
            ((vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *)local_38);
  return local_11e0;
}

Assistant:

movegen::Move thinkyThinky(idx max_moves = 10, const idx samples = 50) {
        auto moves = movegen::genFromBoard(racks_[turn_], gaddag_, state_);
        std::set<movegen::Move, std::greater<movegen::Move>> moves_set(
            moves.begin(), moves.end());
        movegen::Move best = *moves_set.begin();
        // auto best_prob = -9999999999LL;
        // idx maxfails = samples;
        for (auto& mov : moves_set) {
            movegen::print(mov, state_, gaddag_);
            /*
            Game other(*this);
            const auto prob = other.winProbability(samples, mov, maxfails);
            if (prob > best_prob) {
                best = mov;
                best_prob = prob;
                maxfails = samples - prob;
            }
            */

            --max_moves;
            if (max_moves == 0) break;
        }
        /*
        {
            Game other(*this);
            setRack(turn_, empty_rack);
            genRack(turn_);
            movegen::Move change = {0, -1, 0, 0, 0};
            movegen::print(change, state_, gaddag_);
            const auto prob = other.winProbability(samples, change, maxfails);
            if (prob > best_prob) {
                return change;
            }
        }
        */
        return best;
    }